

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_modify_passwords_file_ha1(char *fname,char *domain,char *user,char *ha1)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  size_t sVar6;
  FILE *pFVar7;
  bool bVar8;
  int local_5ec;
  int temp_buf_len;
  int temp_file_offs;
  char *temp_file;
  FILE *fp;
  stat st;
  char h [256];
  char d [256];
  char u [256];
  char line [512];
  uint local_3c;
  int local_38;
  int result;
  int i;
  int found;
  char *ha1_local;
  char *user_local;
  char *domain_local;
  char *fname_local;
  
  bVar1 = false;
  memset(&fp,0,0x90);
  _temp_buf_len = (void *)0x0;
  local_5ec = 0;
  _i = ha1;
  if ((ha1 != (char *)0x0) && (*ha1 == '\0')) {
    _i = (char *)0x0;
  }
  if (((fname == (char *)0x0) || (domain == (char *)0x0)) || (user == (char *)0x0)) {
    return 0;
  }
  pcVar4 = strchr(user,0x3a);
  if (pcVar4 != (char *)0x0) {
    return 0;
  }
  pcVar4 = strchr(domain,0x3a);
  if (pcVar4 != (char *)0x0) {
    return 0;
  }
  local_38 = 0;
  while( true ) {
    bVar8 = false;
    if (local_38 < 0xff) {
      bVar8 = user[local_38] != '\0';
    }
    if (!bVar8) break;
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)(uint)(byte)user[local_38]] & 2) != 0) {
      return 0;
    }
    local_38 = local_38 + 1;
  }
  if (user[local_38] != '\0') {
    return 0;
  }
  local_38 = 0;
  while( true ) {
    bVar8 = false;
    if (local_38 < 0xff) {
      bVar8 = domain[local_38] != '\0';
    }
    if (!bVar8) break;
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)(uint)(byte)domain[local_38]] & 2) != 0) {
      return 0;
    }
    local_38 = local_38 + 1;
  }
  if (domain[local_38] != '\0') {
    return 0;
  }
  sVar6 = strlen(fname);
  if (sVar6 < 0x1000) {
    iVar2 = stat64(fname,(stat64 *)&fp);
    if (iVar2 == 0) {
      if (0xa00000 < (long)st.st_rdev) {
        return 0;
      }
      iVar2 = (int)st.st_rdev + 0x400;
      _temp_buf_len = mg_calloc((long)iVar2,1);
      if (_temp_buf_len == (void *)0x0) {
        return 0;
      }
      pFVar7 = fopen64(fname,"r");
      if (pFVar7 == (FILE *)0x0) {
        mg_free(_temp_buf_len);
        return 0;
      }
      while (pcVar4 = fgets(u + 0xf8,0x200,pFVar7), pcVar4 != (char *)0x0 && local_5ec + 600 < iVar2
            ) {
        iVar3 = __isoc99_sscanf(u + 0xf8,"%255[^:]:%255[^:]:%255s",d + 0xf8,h + 0xf8,
                                st.__glibc_reserved + 2);
        if (iVar3 == 3) {
          u[0xf7] = '\0';
          d[0xf7] = '\0';
          h[0xf7] = '\0';
          iVar3 = strcmp(d + 0xf8,user);
          if ((iVar3 == 0) && (iVar3 = strcmp(h + 0xf8,domain), iVar3 == 0)) {
            if ((_i != (char *)0x0) && (!bVar1)) {
              iVar3 = sprintf((char *)((long)_temp_buf_len + (long)local_5ec),"%s:%s:%s\n",user,
                              domain,_i);
              if (iVar3 < 1) {
                fclose(pFVar7);
                mg_free(_temp_buf_len);
                return 0;
              }
              local_5ec = iVar3 + local_5ec;
            }
            bVar1 = true;
          }
          else {
            iVar3 = sprintf((char *)((long)_temp_buf_len + (long)local_5ec),"%s:%s:%s\n",d + 0xf8,
                            h + 0xf8,st.__glibc_reserved + 2);
            if (iVar3 < 1) {
              fclose(pFVar7);
              mg_free(_temp_buf_len);
              return 0;
            }
            local_5ec = iVar3 + local_5ec;
          }
        }
      }
      fclose(pFVar7);
    }
    pFVar7 = fopen64(fname,"w");
    if (pFVar7 == (FILE *)0x0) {
      mg_free(_temp_buf_len);
      fname_local._4_4_ = 0;
    }
    else {
      iVar2 = fileno(pFVar7);
      iVar2 = fchmod(iVar2,0x180);
      local_3c = (uint)(iVar2 == 0);
      if (((_temp_buf_len != (void *)0x0) && (0 < local_5ec)) &&
         (sVar6 = fwrite(_temp_buf_len,1,(long)local_5ec,pFVar7), sVar6 != (long)local_5ec)) {
        local_3c = 0;
      }
      if (((_i != (char *)0x0) && (!bVar1)) &&
         (iVar2 = fprintf(pFVar7,"%s:%s:%s\n",user,domain,_i), iVar2 < 6)) {
        local_3c = 0;
      }
      iVar2 = fclose(pFVar7);
      if (iVar2 != 0) {
        local_3c = 0;
      }
      mg_free(_temp_buf_len);
      fname_local._4_4_ = local_3c;
    }
    return fname_local._4_4_;
  }
  return 0;
}

Assistant:

CIVETWEB_API int
mg_modify_passwords_file_ha1(const char *fname,
                             const char *domain,
                             const char *user,
                             const char *ha1)
{
	int found = 0, i, result = 1;
	char line[512], u[256], d[256], h[256];
	struct stat st = {0};
	FILE *fp = NULL;
	char *temp_file = NULL;
	int temp_file_offs = 0;

	/* Regard empty password as no password - remove user record. */
	if ((ha1 != NULL) && (ha1[0] == '\0')) {
		ha1 = NULL;
	}

	/* Other arguments must not be empty */
	if ((fname == NULL) || (domain == NULL) || (user == NULL)) {
		return 0;
	}

	/* Using the given file format, user name and domain must not contain
	 * the ':' character */
	if (strchr(user, ':') != NULL) {
		return 0;
	}
	if (strchr(domain, ':') != NULL) {
		return 0;
	}

	/* Do not allow control characters like newline in user name and domain.
	 * Do not allow excessively long names either. */
	for (i = 0; ((i < 255) && (user[i] != 0)); i++) {
		if (iscntrl((unsigned char)user[i])) {
			return 0;
		}
	}
	if (user[i]) {
		return 0; /* user name too long */
	}
	for (i = 0; ((i < 255) && (domain[i] != 0)); i++) {
		if (iscntrl((unsigned char)domain[i])) {
			return 0;
		}
	}
	if (domain[i]) {
		return 0; /* domain name too long */
	}

	/* The maximum length of the path to the password file is limited */
	if (strlen(fname) >= UTF8_PATH_MAX) {
		return 0;
	}

	/* Check if the file exists, and get file size */
	if (0 == stat(fname, &st)) {
		int temp_buf_len;
		if (st.st_size > 10485760) {
			/* Some funster provided a >10 MB text file */
			return 0;
		}

		/* Add enough space for one more line */
		temp_buf_len = (int)st.st_size + 1024;

		/* Allocate memory (instead of using a temporary file) */
		temp_file = (char *)mg_calloc((size_t)temp_buf_len, 1);
		if (!temp_file) {
			/* Out of memory */
			return 0;
		}

		/* File exists. Read it into a memory buffer. */
		fp = fopen(fname, "r");
		if (fp == NULL) {
			/* Cannot read file. No permission? */
			mg_free(temp_file);
			return 0;
		}

		/* Read content and store in memory */
		while ((fgets(line, sizeof(line), fp) != NULL)
		       && ((temp_file_offs + 600) < temp_buf_len)) {
			/* file format is "user:domain:hash\n" */
			if (sscanf(line, "%255[^:]:%255[^:]:%255s", u, d, h) != 3) {
				continue;
			}
			u[255] = 0;
			d[255] = 0;
			h[255] = 0;

			if (!strcmp(u, user) && !strcmp(d, domain)) {
				/* Found the user: change the password hash or drop the user
				 */
				if ((ha1 != NULL) && (!found)) {
					i = sprintf(temp_file + temp_file_offs,
					            "%s:%s:%s\n",
					            user,
					            domain,
					            ha1);
					if (i < 1) {
						fclose(fp);
						mg_free(temp_file);
						return 0;
					}
					temp_file_offs += i;
				}
				found = 1;
			} else {
				/* Copy existing user, including password hash */
				i = sprintf(temp_file + temp_file_offs, "%s:%s:%s\n", u, d, h);
				if (i < 1) {
					fclose(fp);
					mg_free(temp_file);
					return 0;
				}
				temp_file_offs += i;
			}
		}
		fclose(fp);
	}

	/* Create new file */
	fp = fopen(fname, "w");
	if (!fp) {
		mg_free(temp_file);
		return 0;
	}

#if !defined(_WIN32)
	/* On Linux & co., restrict file read/write permissions to the owner */
	if (fchmod(fileno(fp), S_IRUSR | S_IWUSR) != 0) {
		result = 0;
	}
#endif

	if ((temp_file != NULL) && (temp_file_offs > 0)) {
		/* Store buffered content of old file */
		if (fwrite(temp_file, 1, (size_t)temp_file_offs, fp)
		    != (size_t)temp_file_offs) {
			result = 0;
		}
	}

	/* If new user, just add it */
	if ((ha1 != NULL) && (!found)) {
		if (fprintf(fp, "%s:%s:%s\n", user, domain, ha1) < 6) {
			result = 0;
		}
	}

	/* All data written */
	if (fclose(fp) != 0) {
		result = 0;
	}

	mg_free(temp_file);
	return result;
}